

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O3

string * markdown::token::RawText::_processHtmlTagAttributes
                   (string *__return_storage_ptr__,string *src,ReplacementTable *replacements)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_t sVar4;
  long *plVar5;
  TextHolder *p;
  long *plVar6;
  element_type *peVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  smatch mtag;
  string tgttag;
  string fulltag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  smatch m;
  undefined1 local_1e8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1c0;
  bool local_1b8;
  element_type *local_1b0;
  shared_count sStack_1a8;
  int local_1a0;
  bool local_19c;
  undefined8 local_198;
  long local_190;
  undefined1 local_188;
  undefined7 uStack_187;
  char local_16e [6];
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  char *local_138;
  long local_130;
  char local_128;
  undefined7 uStack_127;
  shared_ptr<markdown::Token> local_118;
  element_type local_108;
  long lStack_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_a0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  
  local_a8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  _Var8._M_current = (src->_M_dataplus)._M_p;
  local_d8._M_current = _Var8._M_current + src->_M_string_length;
  while( true ) {
    if (_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
        ::cHtmlToken == '\0') {
      iVar2 = __cxa_guard_acquire(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                   ::cHtmlToken);
      if (iVar2 != 0) {
        boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
        basic_regex(&_processHtmlTagAttributes::cHtmlToken,
                    "<((/?)([a-zA-Z0-9]+)(?:( +[a-zA-Z0-9]+?(?: ?= ?(\"|\').*?\\5))+? */? *))>",0);
        __cxa_atexit(boost::
                     basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                     ~basic_regex,&_processHtmlTagAttributes::cHtmlToken,&__dso_handle);
        __cxa_guard_release(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                             ::cHtmlToken);
      }
    }
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = (char *)0x0;
    local_88.m_null.
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.m_base._M_current = (char *)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.m_subs.
    super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.m_null.matched = false;
    local_88.m_named_subs.px = (element_type *)0x0;
    local_88.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
    local_88.m_last_closed_paren = 0;
    local_88.m_is_singular = true;
    bVar1 = boost::
            regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                      (_Var8,local_d8,&local_88,&_processHtmlTagAttributes::cHtmlToken,
                       format_default,_Var8);
    if (!bVar1) break;
    pvVar3 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&local_88,3);
    if (pvVar3->matched == true) {
      local_1e8._0_8_ = local_1e8 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_1e8,
                 (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_1e8._0_8_ = local_1e8 + 0x10;
      local_1e8._8_8_ = (pointer)0x0;
      local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
    }
    sVar4 = isValidTag((string *)local_1e8,false);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    if (sVar4 == 0) {
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      local_1e8._0_8_ = local_1e8 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_1e8,_Var8._M_current,
                 (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1e8._0_8_);
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      _Var8._M_current =
           (pvVar3->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
    }
    else {
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      local_1e8._0_8_ = local_1e8 + 0x10;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)local_1e8,_Var8._M_current,
                 (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1e8._0_8_);
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      if (pvVar3->matched == true) {
        local_138 = &local_128;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_138,
                   (pvVar3->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (pvVar3->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_138 = &local_128;
        local_130 = 0;
        local_128 = '\0';
      }
      local_158 = &local_148;
      local_150 = 0;
      local_148 = 0;
      local_d0._M_current = local_138 + local_130;
      _Var8._M_current = local_138;
      while( true ) {
        if (_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
            ::cAttributeStrings == '\0') {
          iVar2 = __cxa_guard_acquire(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                       ::cAttributeStrings);
          if (iVar2 != 0) {
            boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
            basic_regex(&_processHtmlTagAttributes::cAttributeStrings,"= ?(\"|\').*?\\1",0);
            __cxa_atexit(boost::
                         basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                         ::~basic_regex,&_processHtmlTagAttributes::cAttributeStrings,&__dso_handle)
            ;
            __cxa_guard_release(&_processHtmlTagAttributes(std::__cxx11::string,std::vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>&)
                                 ::cAttributeStrings);
          }
        }
        local_1c8._M_current = (char *)0x0;
        _Stack_1c0._M_current = (char *)0x0;
        local_1e8._16_8_ = 0;
        local_1e8._24_8_ = 0;
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (pointer)0x0;
        local_1b8 = false;
        local_1b0 = (element_type *)0x0;
        sStack_1a8.pi_ = (sp_counted_base *)0x0;
        local_1a0 = 0;
        local_19c = true;
        bVar1 = boost::
                regex_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                          (_Var8,local_d0,
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_1e8,&_processHtmlTagAttributes::cAttributeStrings,format_default
                           ,_Var8);
        if (!bVar1) break;
        pvVar3 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_1e8,0);
        local_198 = &local_188;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_198,_Var8._M_current,
                   (pvVar3->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current);
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198);
        if (local_198 != &local_188) {
          operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
        }
        local_a0.m_value =
             (long)(replacements->
                   super__Vector_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(replacements->
                   super__Vector_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4;
        local_f0 = (char *)0x0;
        local_e8 = 0;
        local_168 = (char *)((long)&local_198 + 2);
        local_a0.m_czero = '0';
        local_a0.m_zero = 0x30;
        local_160 = local_16e;
        local_f8 = &local_e8;
        local_a0.m_finish = local_16e;
        local_168 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::
                    convert(&local_a0);
        local_160 = local_16e;
        std::__cxx11::string::replace((ulong)&local_f8,0,local_f0,(ulong)local_168);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x1571d5);
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_b8 = *plVar6;
          lStack_b0 = plVar5[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar6;
          local_c8 = (long *)*plVar5;
        }
        local_c0 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
        peVar7 = (element_type *)(plVar5 + 2);
        if ((element_type *)*plVar5 == peVar7) {
          local_108._vptr_Token = peVar7->_vptr_Token;
          lStack_100 = plVar5[3];
          local_118.px = &local_108;
        }
        else {
          local_108._vptr_Token = peVar7->_vptr_Token;
          local_118.px = (element_type *)*plVar5;
        }
        local_118.pn.pi_ = (sp_counted_base *)plVar5[1];
        *plVar5 = (long)peVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_118.px);
        if (local_118.px != &local_108) {
          operator_delete(local_118.px,(long)local_108._vptr_Token + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
        }
        pvVar3 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_1e8,0);
        _Var8._M_current =
             (pvVar3->
             super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).second._M_current;
        p = (TextHolder *)operator_new(0x30);
        pvVar3 = boost::
                 match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)local_1e8,0);
        if (pvVar3->matched == true) {
          local_198 = &local_188;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_198,
                     (pvVar3->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (pvVar3->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_198 = &local_188;
          local_190 = 0;
          local_188 = 0;
        }
        (p->super_Token)._vptr_Token = (_func_int **)&PTR__TextHolder_001662d0;
        (p->mText)._M_dataplus._M_p = (pointer)&(p->mText).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p->mText,local_198,local_198 + local_190);
        p->mCanContainMarkup = false;
        p->mEncodingFlags = 5;
        boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::TextHolder>(&local_118,p);
        std::
        vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
        ::emplace_back<boost::shared_ptr<markdown::Token>>
                  ((vector<boost::shared_ptr<markdown::Token>,std::allocator<boost::shared_ptr<markdown::Token>>>
                    *)replacements,&local_118);
        boost::detail::shared_count::~shared_count(&local_118.pn);
        if (local_198 != &local_188) {
          operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
        }
        boost::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_1e8);
      }
      local_198 = &local_188;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_198,_Var8._M_current,local_d0._M_current);
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198);
      if (local_198 != &local_188) {
        operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_1e8);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_158);
      pvVar3 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&local_88,0);
      _Var8._M_current =
           (pvVar3->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
      if (local_158 != &local_148) {
        operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
      }
    }
    boost::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results(&local_88);
  }
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_1e8,_Var8._M_current,local_d8._M_current);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1e8._0_8_);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string RawText::_processHtmlTagAttributes(std::string src, ReplacementTable&
	replacements)
{
	// Because "Attribute Content Is Not A Code Span"
	std::string tgt;
	std::string::const_iterator prev=src.begin(), end=src.end();
	while (1) {
		static const boost::regex cHtmlToken("<((/?)([a-zA-Z0-9]+)(?:( +[a-zA-Z0-9]+?(?: ?= ?(\"|').*?\\5))+? */? *))>");
		boost::smatch m;
		if (boost::regex_search(prev, end, m, cHtmlToken)) {
			// NOTE: Kludge alert! The `isValidTag` test is a cheat, only here
			// to handle some edge cases between the Markdown test suite and the
			// PHP-Markdown one, which seem to conflict.
			if (isValidTag(m[3])) {
				tgt+=std::string(prev, m[0].first);

				std::string fulltag=m[0], tgttag;
				std::string::const_iterator prevtag=fulltag.begin(), endtag=fulltag.end();
				while (1) {
					static const boost::regex cAttributeStrings("= ?(\"|').*?\\1");
					boost::smatch mtag;
					if (boost::regex_search(prevtag, endtag, mtag, cAttributeStrings)) {
						tgttag+=std::string(prevtag, mtag[0].first);
						tgttag+="\x01@"+boost::lexical_cast<std::string>(replacements.size())+"@htmlTagAttr\x01";
						prevtag=mtag[0].second;

						replacements.push_back(TokenPtr(new TextHolder(std::string(mtag[0]), false, cAmps|cAngles)));
					} else {
						tgttag+=std::string(prevtag, endtag);
						break;
					}
				}
				tgt+=tgttag;
				prev=m[0].second;
			} else {
				tgt+=std::string(prev, m[0].second);
				prev=m[0].second;
			}
		} else {
			tgt+=std::string(prev, end);
			break;
		}
	}

	return tgt;
}